

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O3

void WavParserHelper::PrintDataType(WavDataType DataType)

{
  long lVar1;
  char *pcVar2;
  
  switch(DataType) {
  case WavData8bit:
    pcVar2 = "WavData : uint 8bit";
    break;
  case WavData12bit:
    pcVar2 = "WavData : int 12bit";
    break;
  case WavData16bit:
    pcVar2 = "WavData : int 16bit";
    break;
  case WavData24bit:
    pcVar2 = "WavData : int 24bit";
    break;
  case WavData32bit:
    pcVar2 = "WavData : float 32bit";
    lVar1 = 0x15;
    goto LAB_00102746;
  case WavData64bit:
    pcVar2 = "WavData : double 64bit";
    lVar1 = 0x16;
    goto LAB_00102746;
  default:
    pcVar2 = "WavData : Invalid";
    lVar1 = 0x11;
    goto LAB_00102746;
  }
  lVar1 = 0x13;
LAB_00102746:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void WavParserHelper::PrintDataType(WavDataType DataType)
{
	switch (DataType)
	{
	case WavDataType::WavData8bit:
		std::cout << "WavData : uint 8bit" << std::endl;
		break;
	case WavDataType::WavData12bit:
		std::cout << "WavData : int 12bit" << std::endl;
		break;
	case WavDataType::WavData16bit:
		std::cout << "WavData : int 16bit" << std::endl;
		break;
	case WavDataType::WavData24bit:
		std::cout << "WavData : int 24bit" << std::endl;
		break;
	case WavDataType::WavData32bit:
		std::cout << "WavData : float 32bit" << std::endl;
		break;
	case WavDataType::WavData64bit:
		std::cout << "WavData : double 64bit" << std::endl;
		break;
	default:
		std::cout << "WavData : Invalid" << std::endl;
	}

	return;
}